

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

int __thiscall
Centaurus::ATNMachine<unsigned_char>::add_node
          (ATNMachine<unsigned_char> *this,int from,int priority)

{
  pointer pAVar1;
  int local_18;
  int local_14;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _local_18 = CONCAT44((int)((ulong)((long)(this->m_nodes).
                                           super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1
                                    ) >> 3) * 0x286bca1b,priority);
  std::
  vector<Centaurus::ATNTransition<unsigned_char>,std::allocator<Centaurus::ATNTransition<unsigned_char>>>
  ::emplace_back<int&,int&>
            ((vector<Centaurus::ATNTransition<unsigned_char>,std::allocator<Centaurus::ATNTransition<unsigned_char>>>
              *)&pAVar1[from].m_transitions,&local_14,&local_18);
  std::
  vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>::
  emplace_back<>(&this->m_nodes);
  return (int)((ulong)((long)(this->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_nodes).
                            super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b + -1;
}

Assistant:

int add_node(int from, int priority = 0)
    {
        m_nodes[from].add_transition(m_nodes.size(), priority);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }